

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

void avro::parsing::fixup<boost::shared_ptr<avro::Node>>
               (Symbol *s,
               map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *m,set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                  *seen)

{
  int *piVar1;
  placeholder *ppVar2;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar3;
  shared_ptr<avro::Node> *psVar4;
  _Base_ptr p_Var5;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *pvVar6;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar7;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *ppVar8;
  undefined8 *puVar9;
  _Rb_tree_header *p_Var10;
  ProductionPtr *p;
  pointer p_00;
  _Base_ptr p_Var11;
  bool bVar12;
  Symbol local_58;
  element_type local_48;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_38;
  
  switch(s->kind_) {
  case sRepeater:
    ptVar3 = boost::
             any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&s->extra_);
    fixup_internal<boost::shared_ptr<avro::Node>>(&(ptVar3->super_type).tail.tail.head,m,seen);
    p = &(ptVar3->super_type).tail.tail.tail.head;
    goto LAB_0019315f;
  case sAlternative:
    pvVar6 = boost::
             any_cast<std::vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>>
                       (&s->extra_);
    p_00 = (pvVar6->
           super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (p_00 != (pvVar6->
                super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fixup_internal<boost::shared_ptr<avro::Node>>(p_00,m,seen);
        p_00 = p_00 + 1;
      } while (p_00 != (pvVar6->
                       super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case sPlaceholder:
    psVar4 = boost::any_cast<boost::shared_ptr<avro::Node>const&>(&s->extra_);
    local_58._0_8_ = psVar4->px;
    local_58.extra_.content = (placeholder *)(psVar4->pn).pi_;
    if ((_Base_ptr)local_58.extra_.content != (_Base_ptr)0x0) {
      LOCK();
      *(uint_least32_t *)&((_Base_ptr)local_58.extra_.content)->_M_parent =
           *(uint_least32_t *)&((_Base_ptr)local_58.extra_.content)->_M_parent + 1;
      UNLOCK();
    }
    p_Var10 = &(m->_M_t)._M_impl.super__Rb_tree_header;
    p_Var11 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var10->_M_header;
    for (; p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[bVar12]) {
      bVar12 = p_Var11[1]._M_parent < local_58.extra_.content;
      if (!bVar12) {
        p_Var5 = p_Var11;
      }
    }
    p_Var11 = &p_Var10->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var10) &&
       (p_Var11 = p_Var5, local_58.extra_.content < p_Var5[1]._M_parent)) {
      p_Var11 = &p_Var10->_M_header;
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_58.extra_);
    if ((_Rb_tree_header *)p_Var11 == p_Var10) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_58._0_8_ = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Placeholder symbol cannot be resolved","");
      std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)&local_58);
      *puVar9 = 0x1cd6f0;
      puVar9[1] = 0x1cd720;
      __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
    }
    local_38.px = (element_type *)p_Var11[1]._M_left;
    local_38.pn.pi_ = (sp_counted_base *)p_Var11[1]._M_right;
    if ((_Base_ptr)local_38.pn.pi_ != (_Base_ptr)0x0) {
      LOCK();
      piVar1 = (int *)((long)&((_Base_ptr)local_38.pn.pi_)->_M_parent + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    Symbol::symbolic(&local_58,&local_38);
    s->kind_ = local_58.kind_;
    ppVar2 = (s->extra_).content;
    (s->extra_).content = local_58.extra_.content;
    local_58.extra_.content = (placeholder *)0x0;
    if (ppVar2 != (placeholder *)0x0) {
      (*ppVar2->_vptr_placeholder[1])();
    }
    if (local_58.extra_.content != (placeholder *)0x0) {
      (*(local_58.extra_.content)->_vptr_placeholder[1])();
    }
    boost::detail::weak_count::~weak_count(&local_38.pn);
    break;
  case sIndirect:
    psVar7 = boost::
             any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                       (&s->extra_);
    local_58._0_8_ = psVar7->px;
    local_58.extra_.content = (placeholder *)(psVar7->pn).pi_;
    if ((sp_counted_base *)local_58.extra_.content != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_58.extra_.content)->use_count_ =
           ((sp_counted_base *)local_58.extra_.content)->use_count_ + 1;
      UNLOCK();
    }
    fixup_internal<boost::shared_ptr<avro::Node>>((ProductionPtr *)&local_58,m,seen);
    boost::detail::shared_count::~shared_count((shared_count *)&local_58.extra_);
    break;
  case sUnionAdjust:
    ppVar8 = boost::
             any_cast<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                       (&s->extra_);
    p = &ppVar8->second;
LAB_0019315f:
    fixup_internal<boost::shared_ptr<avro::Node>>(p,m,seen);
    return;
  }
  return;
}

Assistant:

Kind kind() const {
        return kind_;
    }